

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O1

void __thiscall QDnsLookupPrivate::~QDnsLookupPrivate(QDnsLookupPrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR__QDnsLookupPrivate_002d4f98;
  if ((this->sslConfiguration).super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
      super__Optional_payload<QSslConfiguration,_true,_false,_false>.
      super__Optional_payload_base<QSslConfiguration>._M_engaged == true) {
    (this->sslConfiguration).super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
    super__Optional_payload<QSslConfiguration,_true,_false,_false>.
    super__Optional_payload_base<QSslConfiguration>._M_engaged = false;
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&this->sslConfiguration);
  }
  QDnsLookupReply::~QDnsLookupReply(&this->reply);
  QHostAddress::~QHostAddress((QHostAddress *)&this->nameserver);
  pDVar1 = (this->name).super_QPropertyData<QString>.val.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value =
         (Type)((int)(pDVar1->super_QArrayData).ref_._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type *)&(pDVar1->super_QArrayData).ref_._q_value ==
        (__atomic_base<int>)0x0) {
      QArrayData::deallocate
                (&((this->name).super_QPropertyData<QString>.val.d.d)->super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QDnsLookupPrivate()
        : type(QDnsLookup::A)
        , port(0)
        , protocol(QDnsLookup::Standard)
    { }